

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::GELU_x86_avx512::forward_inplace(GELU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  __m256 x;
  __m512 x_00;
  undefined1 auVar21 [64];
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  float fVar50;
  float fVar51;
  float fVar52;
  undefined8 uVar53;
  float fVar56;
  undefined8 uVar54;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined8 uVar60;
  float fVar63;
  undefined8 uVar61;
  float fVar64;
  undefined8 uVar62;
  float fVar65;
  undefined8 uVar66;
  float fVar68;
  undefined8 uVar67;
  float fVar69;
  undefined8 uVar70;
  undefined1 auVar55 [32];
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  v4sf afVar76;
  __m128 _blob_2;
  __m128 _cube_2;
  __m128 _pLoad_2;
  __m128 _fast2c128;
  __m128 _fast1c128;
  __m128 _one128;
  __m128 _half128;
  __m256 _blob_1;
  __m256 _cube_1;
  __m256 _pLoad_1;
  __m256 _fast2c256;
  __m256 _fast1c256;
  __m256 _one256;
  __m256 _half256;
  __m512 _blob;
  __m512 _cube;
  __m512 _pLoad;
  __m512 _fast2c512;
  __m512 _fast1c512;
  __m512 _one512;
  __m512 _half512;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int elempack;
  int h;
  int w;
  Mat *m;
  undefined8 local_1050;
  undefined8 uStackY_1048;
  undefined8 in_stack_ffffffffffffefd8;
  undefined8 in_stack_ffffffffffffefe0;
  undefined8 in_stack_ffffffffffffefe8;
  undefined8 in_stack_ffffffffffffeff0;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  Option *in_stack_fffffffffffff078;
  Mat *in_stack_fffffffffffff080;
  GELU *in_stack_fffffffffffff088;
  undefined8 in_stack_fffffffffffff090;
  undefined8 in_stack_fffffffffffff098;
  undefined8 in_stack_fffffffffffff0a0;
  undefined8 in_stack_fffffffffffff0a8;
  undefined8 in_stack_fffffffffffff0b0;
  undefined1 local_f00 [16];
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 uStack_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 uStack_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  int local_d10;
  undefined8 local_d00;
  undefined8 local_cf8;
  undefined8 local_cf0;
  undefined4 local_ce8;
  long local_ce0;
  undefined4 local_cd8;
  undefined4 local_cd4;
  undefined4 local_cd0;
  undefined4 local_ccc;
  undefined4 local_cc8;
  undefined8 local_cc0;
  undefined1 (*local_cb8) [64];
  int local_cb0;
  int local_cac;
  int local_ca8;
  int local_ca4;
  int local_ca0;
  int local_c9c;
  long *local_c90;
  int local_c7c;
  undefined1 local_c75;
  int local_c74;
  undefined8 *local_c68;
  undefined8 *local_c60;
  undefined8 *local_c50;
  undefined1 local_c40 [64];
  undefined4 local_bc4;
  undefined1 local_bc0 [64];
  undefined4 local_b44;
  undefined1 local_b40 [64];
  undefined4 local_ac4;
  undefined1 local_ac0 [64];
  undefined4 local_a4c;
  undefined1 (*local_a48) [64];
  undefined1 local_a40 [64];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 uStack_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 uStack_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 uStack_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 uStack_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 uStack_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 uStack_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 uStack_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 uStack_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 uStack_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 uStack_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 uStack_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 uStack_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 (*local_5e0) [64];
  undefined4 local_5d8;
  undefined4 local_5d4;
  undefined4 local_5d0;
  undefined4 local_5cc;
  undefined1 (*local_5c8) [64];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  Option *pOStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  Option *pOStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  Option *pOStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  Option *pOStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 (*local_398) [64];
  undefined4 local_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined4 local_374;
  undefined4 local_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined4 local_354;
  undefined4 local_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined4 local_334;
  undefined4 local_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  undefined4 local_31c;
  undefined1 (*local_318) [64];
  float local_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined1 (*local_1f8) [64];
  long local_1f0;
  undefined4 local_1e4;
  long local_1e0;
  undefined1 (*local_1d8) [64];
  undefined4 local_1cc;
  int local_1c8;
  int local_1c4;
  undefined8 *local_1c0;
  undefined4 local_1b4;
  long local_1b0;
  undefined8 *local_190;
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  undefined4 local_140;
  undefined4 local_13c;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 local_12c;
  undefined4 local_128;
  undefined4 local_124;
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined4 local_100;
  undefined4 local_fc;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  undefined1 local_e0 [16];
  undefined1 auStack_d0 [16];
  undefined4 local_c0;
  undefined4 local_bc;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined1 local_a0 [16];
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
    local_c7c = GELU::forward_inplace
                          (in_stack_fffffffffffff088,in_stack_fffffffffffff080,
                           in_stack_fffffffffffff078);
  }
  else {
    local_c9c = *(int *)((long)in_RSI + 0x2c);
    local_ca0 = (int)in_RSI[6];
    local_ca4 = (int)in_RSI[3];
    local_ca8 = (int)in_RSI[7];
    local_cac = local_c9c * local_ca0 * local_ca4;
    local_c90 = in_RSI;
    for (local_cb0 = 0; local_cb0 < local_ca8; local_cb0 = local_cb0 + 1) {
      local_c68 = &local_d00;
      local_1c4 = *(int *)((long)local_c90 + 0x2c);
      local_1c8 = (int)local_c90[6];
      local_1cc = *(undefined4 *)((long)local_c90 + 0x34);
      local_cb8 = (undefined1 (*) [64])(*local_c90 + local_c90[8] * (long)local_cb0 * local_c90[2]);
      local_1e0 = local_c90[2];
      local_1e4 = (undefined4)local_c90[3];
      local_1f0 = local_c90[4];
      local_1c0 = &local_d00;
      local_1b0 = (long)local_1c4 * (long)local_1c8 * local_1e0;
      local_c60 = &local_d00;
      local_c50 = &local_d00;
      local_1b4 = 0x10;
      local_c74 = local_cb0;
      local_c75 = 1;
      local_d00 = 0;
      local_cf0 = 0;
      local_ce8 = 0;
      local_cd8 = 0;
      local_cd4 = 0;
      local_cd0 = 0;
      local_ccc = 0;
      local_cc8 = 0;
      local_cc0 = 0;
      local_cf8 = 0;
      local_d10 = 0;
      local_a4c = 0x3f000000;
      auVar45 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
      local_ac0._0_8_ = auVar45._0_8_;
      uVar37 = local_ac0._0_8_;
      local_ac0._8_8_ = auVar45._8_8_;
      uVar38 = local_ac0._8_8_;
      local_ac0._16_8_ = auVar45._16_8_;
      uVar39 = local_ac0._16_8_;
      local_ac0._24_8_ = auVar45._24_8_;
      uVar40 = local_ac0._24_8_;
      local_ac0._32_8_ = auVar45._32_8_;
      uVar41 = local_ac0._32_8_;
      local_ac0._40_8_ = auVar45._40_8_;
      uVar42 = local_ac0._40_8_;
      local_ac0._48_8_ = auVar45._48_8_;
      uVar43 = local_ac0._48_8_;
      local_ac0._56_8_ = auVar45._56_8_;
      uVar44 = local_ac0._56_8_;
      local_ac4 = 0x3f800000;
      auVar46 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_b40._0_8_ = auVar46._0_8_;
      uVar29 = local_b40._0_8_;
      local_b40._8_8_ = auVar46._8_8_;
      uVar30 = local_b40._8_8_;
      local_b40._16_8_ = auVar46._16_8_;
      uVar31 = local_b40._16_8_;
      local_b40._24_8_ = auVar46._24_8_;
      uVar32 = local_b40._24_8_;
      local_b40._32_8_ = auVar46._32_8_;
      uVar33 = local_b40._32_8_;
      local_b40._40_8_ = auVar46._40_8_;
      uVar34 = local_b40._40_8_;
      local_b40._48_8_ = auVar46._48_8_;
      uVar35 = local_b40._48_8_;
      local_b40._56_8_ = auVar46._56_8_;
      uVar36 = local_b40._56_8_;
      local_b44 = 0x3f4c4229;
      auVar47 = vbroadcastss_avx512f(ZEXT416(0x3f4c4229));
      local_bc0._0_8_ = auVar47._0_8_;
      uVar28 = local_bc0._0_8_;
      local_bc0._8_8_ = auVar47._8_8_;
      uVar10 = local_bc0._8_8_;
      local_bc0._16_8_ = auVar47._16_8_;
      uVar11 = local_bc0._16_8_;
      local_bc0._24_8_ = auVar47._24_8_;
      uVar12 = local_bc0._24_8_;
      local_bc0._32_8_ = auVar47._32_8_;
      uVar54 = local_bc0._32_8_;
      local_bc0._40_8_ = auVar47._40_8_;
      uVar61 = local_bc0._40_8_;
      local_bc0._48_8_ = auVar47._48_8_;
      uVar67 = local_bc0._48_8_;
      local_bc0._56_8_ = auVar47._56_8_;
      uVar71 = local_bc0._56_8_;
      local_bc4 = 0x3d372713;
      auVar48 = vbroadcastss_avx512f(ZEXT416(0x3d372713));
      local_c40._0_8_ = auVar48._0_8_;
      uVar9 = local_c40._0_8_;
      local_c40._8_8_ = auVar48._8_8_;
      uVar62 = local_c40._8_8_;
      local_c40._16_8_ = auVar48._16_8_;
      uVar22 = local_c40._16_8_;
      local_c40._24_8_ = auVar48._24_8_;
      uVar23 = local_c40._24_8_;
      local_c40._32_8_ = auVar48._32_8_;
      uVar24 = local_c40._32_8_;
      local_c40._40_8_ = auVar48._40_8_;
      uVar25 = local_c40._40_8_;
      local_c40._48_8_ = auVar48._48_8_;
      uVar26 = local_c40._48_8_;
      local_c40._56_8_ = auVar48._56_8_;
      uVar27 = local_c40._56_8_;
      local_c40 = auVar48;
      local_bc0 = auVar47;
      local_b40 = auVar46;
      local_ac0 = auVar45;
      local_1d8 = local_cb8;
      local_190 = local_c50;
      local_ce0 = local_1f0;
      for (; local_d10 + 0xf < local_cac; local_d10 = local_d10 + 0x10) {
        local_a48 = local_cb8;
        uVar13 = *(undefined8 *)*local_cb8;
        uVar14 = *(undefined8 *)(*local_cb8 + 8);
        uVar15 = *(undefined8 *)(*local_cb8 + 0x10);
        uVar16 = *(undefined8 *)(*local_cb8 + 0x18);
        uVar17 = *(undefined8 *)(*local_cb8 + 0x20);
        uVar18 = *(undefined8 *)(*local_cb8 + 0x28);
        uVar19 = *(undefined8 *)(*local_cb8 + 0x30);
        uVar20 = *(undefined8 *)(*local_cb8 + 0x38);
        auVar21 = *local_cb8;
        auVar49 = vmulps_avx512f(*local_cb8,*local_cb8);
        local_ec0 = auVar49._0_8_;
        uStack_eb8 = auVar49._8_8_;
        uStack_eb0 = auVar49._16_8_;
        uStack_ea8 = auVar49._24_8_;
        uStack_ea0 = auVar49._32_8_;
        uStack_e98 = auVar49._40_8_;
        uStack_e90 = auVar49._48_8_;
        uStack_e88 = auVar49._56_8_;
        local_840 = local_ec0;
        uStack_838 = uStack_eb8;
        uStack_830 = uStack_eb0;
        uStack_828 = uStack_ea8;
        uStack_820 = uStack_ea0;
        uStack_818 = uStack_e98;
        uStack_810 = uStack_e90;
        uStack_808 = uStack_e88;
        auVar49 = vmulps_avx512f(*local_cb8,auVar49);
        local_ec0 = auVar49._0_8_;
        uStack_eb8 = auVar49._8_8_;
        uStack_eb0 = auVar49._16_8_;
        uStack_ea8 = auVar49._24_8_;
        uStack_ea0 = auVar49._32_8_;
        uStack_e98 = auVar49._40_8_;
        uStack_e90 = auVar49._48_8_;
        uStack_e88 = auVar49._56_8_;
        local_880 = uVar9;
        uStack_878 = uVar62;
        uStack_870 = uVar22;
        uStack_868 = uVar23;
        uStack_860 = uVar24;
        uStack_858 = uVar25;
        uStack_850 = uVar26;
        uStack_848 = uVar27;
        local_8c0 = local_ec0;
        uStack_8b8 = uStack_eb8;
        uStack_8b0 = uStack_eb0;
        uStack_8a8 = uStack_ea8;
        uStack_8a0 = uStack_ea0;
        uStack_898 = uStack_e98;
        uStack_890 = uStack_e90;
        uStack_888 = uStack_e88;
        auVar49 = vmulps_avx512f(auVar48,auVar49);
        local_f00._0_8_ = auVar49._0_8_;
        local_f00._8_8_ = auVar49._8_8_;
        uStack_ef0 = auVar49._16_8_;
        uStack_ee8 = auVar49._24_8_;
        uStack_ee0 = auVar49._32_8_;
        uStack_ed8 = auVar49._40_8_;
        uStack_ed0 = auVar49._48_8_;
        uStack_ec8 = auVar49._56_8_;
        local_6c0 = local_f00._0_8_;
        uStack_6b8 = local_f00._8_8_;
        uStack_6b0 = uStack_ef0;
        uStack_6a8 = uStack_ee8;
        uStack_6a0 = uStack_ee0;
        uStack_698 = uStack_ed8;
        uStack_690 = uStack_ed0;
        uStack_688 = uStack_ec8;
        auVar49 = vaddps_avx512f(*local_cb8,auVar49);
        local_f00._0_8_ = auVar49._0_8_;
        local_f00._8_8_ = auVar49._8_8_;
        uStack_ef0 = auVar49._16_8_;
        uStack_ee8 = auVar49._24_8_;
        uStack_ee0 = auVar49._32_8_;
        uStack_ed8 = auVar49._40_8_;
        uStack_ed0 = auVar49._48_8_;
        uStack_ec8 = auVar49._56_8_;
        local_900 = uVar28;
        uStack_8f8 = uVar10;
        uStack_8f0 = uVar11;
        uStack_8e8 = uVar12;
        uStack_8e0 = uVar54;
        uStack_8d8 = uVar61;
        uStack_8d0 = uVar67;
        uStack_8c8 = uVar71;
        local_940 = local_f00._0_8_;
        uStack_938 = local_f00._8_8_;
        uStack_930 = uStack_ef0;
        uStack_928 = uStack_ee8;
        uStack_920 = uStack_ee0;
        uStack_918 = uStack_ed8;
        uStack_910 = uStack_ed0;
        uStack_908 = uStack_ec8;
        auVar49 = vmulps_avx512f(auVar47,auVar49);
        local_f00._0_8_ = auVar49._0_8_;
        local_f00._8_8_ = auVar49._8_8_;
        uStack_ef0 = auVar49._16_8_;
        uStack_ee8 = auVar49._24_8_;
        uStack_ee0 = auVar49._32_8_;
        uStack_ed8 = auVar49._40_8_;
        uStack_ed0 = auVar49._48_8_;
        uStack_ec8 = auVar49._56_8_;
        x_00._8_8_ = in_stack_fffffffffffff080;
        x_00._0_8_ = in_stack_fffffffffffff078;
        x_00._16_8_ = in_stack_fffffffffffff088;
        x_00[6] = (float)(int)in_stack_fffffffffffff090;
        x_00[7] = (float)(int)((ulong)in_stack_fffffffffffff090 >> 0x20);
        x_00[8] = (float)(int)in_stack_fffffffffffff098;
        x_00[9] = (float)(int)((ulong)in_stack_fffffffffffff098 >> 0x20);
        x_00[10] = (float)(int)in_stack_fffffffffffff0a0;
        x_00[0xb] = (float)(int)((ulong)in_stack_fffffffffffff0a0 >> 0x20);
        x_00[0xc] = (float)(int)in_stack_fffffffffffff0a8;
        x_00[0xd] = (float)(int)((ulong)in_stack_fffffffffffff0a8 >> 0x20);
        x_00[0xe] = (float)(int)in_stack_fffffffffffff0b0;
        x_00[0xf] = (float)(int)((ulong)in_stack_fffffffffffff0b0 >> 0x20);
        uVar53 = local_f00._0_8_;
        uVar60 = local_f00._8_8_;
        uVar66 = uStack_ef0;
        uVar70 = uStack_ee8;
        uVar72 = uStack_ee0;
        uVar73 = uStack_ed8;
        uVar74 = uStack_ed0;
        uVar75 = uStack_ec8;
        local_800 = uVar13;
        uStack_7f8 = uVar14;
        uStack_7f0 = uVar15;
        uStack_7e8 = uVar16;
        uStack_7e0 = uVar17;
        uStack_7d8 = uVar18;
        uStack_7d0 = uVar19;
        uStack_7c8 = uVar20;
        local_7c0 = uVar13;
        uStack_7b8 = uVar14;
        uStack_7b0 = uVar15;
        uStack_7a8 = uVar16;
        uStack_7a0 = uVar17;
        uStack_798 = uVar18;
        uStack_790 = uVar19;
        uStack_788 = uVar20;
        local_780 = uVar13;
        uStack_778 = uVar14;
        uStack_770 = uVar15;
        uStack_768 = uVar16;
        uStack_760 = uVar17;
        uStack_758 = uVar18;
        uStack_750 = uVar19;
        uStack_748 = uVar20;
        local_680 = uVar13;
        uStack_678 = uVar14;
        uStack_670 = uVar15;
        uStack_668 = uVar16;
        uStack_660 = uVar17;
        uStack_658 = uVar18;
        uStack_650 = uVar19;
        uStack_648 = uVar20;
        tanh512_ps(x_00);
        local_f00._8_8_ = uVar60;
        local_f00._0_8_ = uVar53;
        local_700 = uVar29;
        uStack_6f8 = uVar30;
        uStack_6f0 = uVar31;
        uStack_6e8 = uVar32;
        uStack_6e0 = uVar33;
        uStack_6d8 = uVar34;
        uStack_6d0 = uVar35;
        uStack_6c8 = uVar36;
        auVar49._16_8_ = uVar66;
        auVar49._0_16_ = local_f00;
        auVar49._24_8_ = uVar70;
        auVar49._32_8_ = uVar72;
        auVar49._40_8_ = uVar73;
        auVar49._48_8_ = uVar74;
        auVar49._56_8_ = uVar75;
        auVar49 = vaddps_avx512f(auVar46,auVar49);
        local_a00 = uVar37;
        uStack_9f8 = uVar38;
        uStack_9f0 = uVar39;
        uStack_9e8 = uVar40;
        uStack_9e0 = uVar41;
        uStack_9d8 = uVar42;
        uStack_9d0 = uVar43;
        uStack_9c8 = uVar44;
        local_f00._0_8_ = auVar49._0_8_;
        local_980 = local_f00._0_8_;
        local_f00._8_8_ = auVar49._8_8_;
        uStack_978 = local_f00._8_8_;
        uStack_ef0 = auVar49._16_8_;
        uStack_970 = uStack_ef0;
        uStack_ee8 = auVar49._24_8_;
        uStack_968 = uStack_ee8;
        uStack_ee0 = auVar49._32_8_;
        uStack_960 = uStack_ee0;
        uStack_ed8 = auVar49._40_8_;
        uStack_958 = uStack_ed8;
        uStack_ed0 = auVar49._48_8_;
        uStack_950 = uStack_ed0;
        uStack_ec8 = auVar49._56_8_;
        uStack_948 = uStack_ec8;
        local_a40 = vmulps_avx512f(auVar49,auVar21);
        auVar49 = vmulps_avx512f(auVar45,local_a40);
        local_5e0 = local_cb8;
        local_f00._0_8_ = auVar49._0_8_;
        local_640 = local_f00._0_8_;
        local_f00._8_8_ = auVar49._8_8_;
        uStack_638 = local_f00._8_8_;
        uStack_ef0 = auVar49._16_8_;
        uStack_630 = uStack_ef0;
        uStack_ee8 = auVar49._24_8_;
        uStack_628 = uStack_ee8;
        uStack_ee0 = auVar49._32_8_;
        uStack_620 = uStack_ee0;
        uStack_ed8 = auVar49._40_8_;
        uStack_618 = uStack_ed8;
        uStack_ed0 = auVar49._48_8_;
        uStack_610 = uStack_ed0;
        uStack_ec8 = auVar49._56_8_;
        uStack_608 = uStack_ec8;
        *(undefined8 *)*local_cb8 = local_f00._0_8_;
        *(undefined8 *)(*local_cb8 + 8) = local_f00._8_8_;
        *(undefined8 *)(*local_cb8 + 0x10) = uStack_ef0;
        *(undefined8 *)(*local_cb8 + 0x18) = uStack_ee8;
        *(undefined8 *)(*local_cb8 + 0x20) = uStack_ee0;
        *(undefined8 *)(*local_cb8 + 0x28) = uStack_ed8;
        *(undefined8 *)(*local_cb8 + 0x30) = uStack_ed0;
        *(undefined8 *)(*local_cb8 + 0x38) = uStack_ec8;
        local_cb8 = local_cb8 + 1;
        local_9c0 = uVar13;
        uStack_9b8 = uVar14;
        uStack_9b0 = uVar15;
        uStack_9a8 = uVar16;
        uStack_9a0 = uVar17;
        uStack_998 = uVar18;
        uStack_990 = uVar19;
        uStack_988 = uVar20;
        local_740 = uVar53;
        uStack_738 = uVar60;
        uStack_730 = uVar66;
        uStack_728 = uVar70;
        uStack_720 = uVar72;
        uStack_718 = uVar73;
        uStack_710 = uVar74;
        uStack_708 = uVar75;
      }
      local_5cc = 0x3f000000;
      local_124 = 0x3f000000;
      local_128 = 0x3f000000;
      local_12c = 0x3f000000;
      local_130 = 0x3f000000;
      local_134 = 0x3f000000;
      local_138 = 0x3f000000;
      local_13c = 0x3f000000;
      local_140 = 0x3f000000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f000000),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f000000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f000000),0x20);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f000000),0x30);
      local_160._0_8_ = auVar2._0_8_;
      uVar9 = local_160._0_8_;
      local_160._8_8_ = auVar2._8_8_;
      uVar62 = local_160._8_8_;
      auStack_150._0_8_ = auVar3._0_8_;
      uVar22 = auStack_150._0_8_;
      auStack_150._8_8_ = auVar3._8_8_;
      uVar23 = auStack_150._8_8_;
      local_5d0 = 0x3f800000;
      local_e4 = 0x3f800000;
      local_e8 = 0x3f800000;
      local_ec = 0x3f800000;
      local_f0 = 0x3f800000;
      local_f4 = 0x3f800000;
      local_f8 = 0x3f800000;
      local_fc = 0x3f800000;
      local_100 = 0x3f800000;
      auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
      auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
      local_120._0_8_ = auVar4._0_8_;
      uVar24 = local_120._0_8_;
      local_120._8_8_ = auVar4._8_8_;
      uVar25 = local_120._8_8_;
      auStack_110._0_8_ = auVar5._0_8_;
      uVar26 = auStack_110._0_8_;
      auStack_110._8_8_ = auVar5._8_8_;
      uVar27 = auStack_110._8_8_;
      local_5d4 = 0x3f4c4229;
      local_a4 = 0x3f4c4229;
      local_a8 = 0x3f4c4229;
      local_ac = 0x3f4c4229;
      local_b0 = 0x3f4c4229;
      local_b4 = 0x3f4c4229;
      local_b8 = 0x3f4c4229;
      local_bc = 0x3f4c4229;
      local_c0 = 0x3f4c4229;
      auVar6 = vinsertps_avx(ZEXT416(0x3f4c4229),ZEXT416(0x3f4c4229),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f4c4229),0x20);
      local_e0 = vinsertps_avx(auVar6,ZEXT416(0x3f4c4229),0x30);
      auVar6 = vinsertps_avx(ZEXT416(0x3f4c4229),ZEXT416(0x3f4c4229),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f4c4229),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f4c4229),0x30);
      auStack_d0._0_8_ = auVar6._0_8_;
      auStack_d0._8_8_ = auVar6._8_8_;
      uVar28 = auStack_d0._8_8_;
      local_5d8 = 0x3d372713;
      local_54 = 0x3d372713;
      local_58 = 0x3d372713;
      local_5c = 0x3d372713;
      local_60 = 0x3d372713;
      local_64 = 0x3d372713;
      local_68 = 0x3d372713;
      local_6c = 0x3d372713;
      local_70 = 0x3d372713;
      auVar7 = vinsertps_avx(ZEXT416(0x3d372713),ZEXT416(0x3d372713),0x10);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3d372713),0x20);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3d372713),0x30);
      auVar8 = vinsertps_avx(ZEXT416(0x3d372713),ZEXT416(0x3d372713),0x10);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3d372713),0x20);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3d372713),0x30);
      auVar55._16_16_ = auVar7;
      auVar55._0_16_ = auVar8;
      local_a0._0_8_ = auVar8._0_8_;
      local_a0._8_8_ = auVar8._8_8_;
      uStack_90 = auVar7._0_8_;
      uStack_88 = auVar7._8_8_;
      in_stack_fffffffffffff080 = (Mat *)local_a0._0_8_;
      in_stack_fffffffffffff088 = (GELU *)local_a0._8_8_;
      in_stack_fffffffffffff090 = uStack_90;
      in_stack_fffffffffffff098 = uStack_88;
      in_stack_fffffffffffff0a0 = local_e0._0_8_;
      in_stack_fffffffffffff0a8 = local_e0._8_8_;
      in_stack_fffffffffffff0b0 = auStack_d0._0_8_;
      local_160 = auVar2;
      auStack_150 = auVar3;
      local_120 = auVar4;
      auStack_110 = auVar5;
      auStack_d0 = auVar6;
      _local_a0 = auVar55;
      for (; local_d10 + 7 < local_cac; local_d10 = local_d10 + 8) {
        local_5c8 = local_cb8;
        uVar10 = *(undefined8 *)*local_cb8;
        uVar11 = *(undefined8 *)(*local_cb8 + 8);
        uVar12 = *(undefined8 *)(*local_cb8 + 0x10);
        in_stack_fffffffffffff078 = *(Option **)(*local_cb8 + 0x18);
        local_460._0_4_ = (float)uVar10;
        fVar1 = (float)local_460;
        local_460._4_4_ = (float)((ulong)uVar10 >> 0x20);
        fVar52 = local_460._4_4_;
        uStack_458._0_4_ = (float)uVar11;
        fVar51 = (float)uStack_458;
        uStack_458._4_4_ = (float)((ulong)uVar11 >> 0x20);
        fVar57 = uStack_458._4_4_;
        uStack_450._0_4_ = (float)uVar12;
        fVar59 = (float)uStack_450;
        uStack_450._4_4_ = (float)((ulong)uVar12 >> 0x20);
        fVar64 = uStack_450._4_4_;
        uStack_448._0_4_ = SUB84(in_stack_fffffffffffff078,0);
        uStack_448._4_4_ = (float)((ulong)in_stack_fffffffffffff078 >> 0x20);
        local_4c0 = CONCAT44(local_460._4_4_ * local_460._4_4_,(float)local_460 * (float)local_460);
        uStack_4b8 = CONCAT44(uStack_458._4_4_ * uStack_458._4_4_,
                              (float)uStack_458 * (float)uStack_458);
        uStack_4b0 = CONCAT44(uStack_450._4_4_ * uStack_450._4_4_,
                              (float)uStack_450 * (float)uStack_450);
        uStack_4a8 = CONCAT44(uStack_448._4_4_,(float)uStack_448 * (float)uStack_448);
        fVar50 = (float)local_460 * (float)local_460 * (float)local_460;
        fVar56 = local_460._4_4_ * local_460._4_4_ * local_460._4_4_;
        fVar58 = (float)uStack_458 * (float)uStack_458 * (float)uStack_458;
        fVar63 = uStack_458._4_4_ * uStack_458._4_4_ * uStack_458._4_4_;
        fVar65 = (float)uStack_450 * (float)uStack_450 * (float)uStack_450;
        fVar68 = uStack_450._4_4_ * uStack_450._4_4_ * uStack_450._4_4_;
        fVar69 = (float)uStack_448 * (float)uStack_448 * (float)uStack_448;
        local_500 = CONCAT44(fVar56,fVar50);
        uStack_4f8 = CONCAT44(fVar63,fVar58);
        uStack_4f0 = CONCAT44(fVar68,fVar65);
        uStack_4e8 = CONCAT44(uStack_448._4_4_,fVar69);
        local_4e0._0_4_ = SUB84(in_stack_fffffffffffff080,0);
        local_4e0._4_4_ = (float)((ulong)in_stack_fffffffffffff080 >> 0x20);
        uStack_4d8._0_4_ = SUB84(in_stack_fffffffffffff088,0);
        uStack_4d8._4_4_ = (float)((ulong)in_stack_fffffffffffff088 >> 0x20);
        uStack_4d0._0_4_ = (float)in_stack_fffffffffffff090;
        uStack_4d0._4_4_ = (float)((ulong)in_stack_fffffffffffff090 >> 0x20);
        uStack_4c8._0_4_ = (float)in_stack_fffffffffffff098;
        uStack_4c8._4_4_ = (float)((ulong)in_stack_fffffffffffff098 >> 0x20);
        local_4e0._0_4_ = (float)local_4e0 * fVar50;
        local_4e0._4_4_ = local_4e0._4_4_ * fVar56;
        uStack_4d8._0_4_ = (float)uStack_4d8 * fVar58;
        uStack_4d8._4_4_ = uStack_4d8._4_4_ * fVar63;
        uStack_4d0._0_4_ = (float)uStack_4d0 * fVar65;
        uStack_4d0._4_4_ = uStack_4d0._4_4_ * fVar68;
        uStack_4c8._0_4_ = (float)uStack_4c8 * fVar69;
        local_fe0 = CONCAT44(local_4e0._4_4_,(float)local_4e0);
        uStack_fd8 = CONCAT44(uStack_4d8._4_4_,(float)uStack_4d8);
        uStack_fd0 = CONCAT44(uStack_4d0._4_4_,(float)uStack_4d0);
        uStack_fc8 = CONCAT44(uStack_4c8._4_4_,(float)uStack_4c8);
        local_400 = local_fe0;
        uStack_3f8 = uStack_fd8;
        uStack_3f0 = uStack_fd0;
        uStack_3e8 = uStack_fc8;
        local_460._0_4_ = (float)local_460 + (float)local_4e0;
        local_460._4_4_ = local_460._4_4_ + local_4e0._4_4_;
        uStack_458._0_4_ = (float)uStack_458 + (float)uStack_4d8;
        uStack_458._4_4_ = uStack_458._4_4_ + uStack_4d8._4_4_;
        uStack_450._0_4_ = (float)uStack_450 + (float)uStack_4d0;
        uStack_450._4_4_ = uStack_450._4_4_ + uStack_4d0._4_4_;
        uStack_448._0_4_ = (float)uStack_448 + (float)uStack_4c8;
        local_fe0 = CONCAT44(local_460._4_4_,(float)local_460);
        uStack_fd8 = CONCAT44(uStack_458._4_4_,(float)uStack_458);
        uStack_fd0 = CONCAT44(uStack_450._4_4_,(float)uStack_450);
        uStack_fc8 = CONCAT44(uStack_448._4_4_ + uStack_4c8._4_4_,(float)uStack_448);
        uStack_508 = uVar28;
        local_540 = local_fe0;
        uStack_538 = uStack_fd8;
        uStack_530 = uStack_fd0;
        uStack_528 = uStack_fc8;
        local_520._0_4_ = (float)in_stack_fffffffffffff0a0;
        local_520._4_4_ = (float)((ulong)in_stack_fffffffffffff0a0 >> 0x20);
        uStack_518._0_4_ = (float)in_stack_fffffffffffff0a8;
        uStack_518._4_4_ = (float)((ulong)in_stack_fffffffffffff0a8 >> 0x20);
        uStack_510._0_4_ = (float)in_stack_fffffffffffff0b0;
        uStack_510._4_4_ = (float)((ulong)in_stack_fffffffffffff0b0 >> 0x20);
        uStack_508._0_4_ = auVar6._8_4_;
        uStack_508._4_4_ = auVar6._12_4_;
        local_fe0 = CONCAT44(local_520._4_4_ * local_460._4_4_,(float)local_520 * (float)local_460);
        uStack_fd8 = CONCAT44(uStack_518._4_4_ * uStack_458._4_4_,
                              (float)uStack_518 * (float)uStack_458);
        uStack_fd0 = CONCAT44(uStack_510._4_4_ * uStack_450._4_4_,
                              (float)uStack_510 * (float)uStack_450);
        uStack_fc8 = CONCAT44(uStack_508._4_4_,(float)uStack_508 * (float)uStack_448);
        x[2] = (float)(int)in_stack_ffffffffffffefe0;
        x[3] = (float)(int)((ulong)in_stack_ffffffffffffefe0 >> 0x20);
        x[0] = (float)(int)in_stack_ffffffffffffefd8;
        x[1] = (float)(int)((ulong)in_stack_ffffffffffffefd8 >> 0x20);
        x[4] = (float)(int)in_stack_ffffffffffffefe8;
        x[5] = (float)(int)((ulong)in_stack_ffffffffffffefe8 >> 0x20);
        x[6] = (float)(int)in_stack_ffffffffffffeff0;
        x[7] = (float)(int)((ulong)in_stack_ffffffffffffeff0 >> 0x20);
        uVar54 = local_fe0;
        uVar61 = uStack_fd8;
        uVar67 = uStack_fd0;
        uVar71 = uStack_fc8;
        local_520 = in_stack_fffffffffffff0a0;
        uStack_518 = in_stack_fffffffffffff0a8;
        uStack_510 = in_stack_fffffffffffff0b0;
        uStack_508 = uVar28;
        local_4e0 = in_stack_fffffffffffff080;
        uStack_4d8 = in_stack_fffffffffffff088;
        uStack_4d0 = in_stack_fffffffffffff090;
        uStack_4c8 = in_stack_fffffffffffff098;
        local_4a0 = uVar10;
        uStack_498 = uVar11;
        uStack_490 = uVar12;
        pOStack_488 = in_stack_fffffffffffff078;
        local_480 = uVar10;
        uStack_478 = uVar11;
        uStack_470 = uVar12;
        pOStack_468 = in_stack_fffffffffffff078;
        local_460 = uVar10;
        uStack_458 = uVar11;
        uStack_450 = uVar12;
        uStack_448 = in_stack_fffffffffffff078;
        local_3e0 = uVar10;
        uStack_3d8 = uVar11;
        uStack_3d0 = uVar12;
        pOStack_3c8 = in_stack_fffffffffffff078;
        tanh256_ps(x);
        local_420._0_4_ = auVar4._0_4_;
        local_420._4_4_ = auVar4._4_4_;
        uStack_418._0_4_ = auVar4._8_4_;
        uStack_418._4_4_ = auVar4._12_4_;
        uStack_410._0_4_ = auVar5._0_4_;
        uStack_410._4_4_ = auVar5._4_4_;
        uStack_408._0_4_ = auVar5._8_4_;
        uStack_408._4_4_ = auVar5._12_4_;
        local_440._0_4_ = (float)uVar54;
        local_440._4_4_ = (float)((ulong)uVar54 >> 0x20);
        uStack_438._0_4_ = (float)uVar61;
        uStack_438._4_4_ = (float)((ulong)uVar61 >> 0x20);
        uStack_430._0_4_ = (float)uVar67;
        uStack_430._4_4_ = (float)((ulong)uVar67 >> 0x20);
        uStack_428._0_4_ = (float)uVar71;
        uStack_428._4_4_ = (float)((ulong)uVar71 >> 0x20);
        fStack_5a4 = uStack_408._4_4_ + uStack_428._4_4_;
        local_fe0 = CONCAT44(local_420._4_4_ + local_440._4_4_,(float)local_420 + (float)local_440);
        uStack_fd8 = CONCAT44(uStack_418._4_4_ + uStack_438._4_4_,
                              (float)uStack_418 + (float)uStack_438);
        uStack_fd0 = CONCAT44(uStack_410._4_4_ + uStack_430._4_4_,
                              (float)uStack_410 + (float)uStack_430);
        uStack_fc8 = CONCAT44(fStack_5a4,(float)uStack_408 + (float)uStack_428);
        local_560 = local_fe0;
        uStack_558 = uStack_fd8;
        uStack_550 = uStack_fd0;
        uStack_548 = uStack_fc8;
        pOStack_568._0_4_ = SUB84(in_stack_fffffffffffff078,0);
        local_5c0 = ((float)local_420 + (float)local_440) * fVar1;
        fStack_5bc = (local_420._4_4_ + local_440._4_4_) * fVar52;
        fStack_5b8 = ((float)uStack_418 + (float)uStack_438) * fVar51;
        fStack_5b4 = (uStack_418._4_4_ + uStack_438._4_4_) * fVar57;
        fStack_5b0 = ((float)uStack_410 + (float)uStack_430) * fVar59;
        fStack_5ac = (uStack_410._4_4_ + uStack_430._4_4_) * fVar64;
        fStack_5a8 = ((float)uStack_408 + (float)uStack_428) * pOStack_568._0_4_;
        local_5a0._0_4_ = auVar2._0_4_;
        local_5a0._4_4_ = auVar2._4_4_;
        uStack_598._0_4_ = auVar2._8_4_;
        uStack_598._4_4_ = auVar2._12_4_;
        uStack_590._0_4_ = auVar3._0_4_;
        uStack_590._4_4_ = auVar3._4_4_;
        uStack_588._0_4_ = auVar3._8_4_;
        uStack_588._4_4_ = auVar3._12_4_;
        local_fe0 = CONCAT44(local_5a0._4_4_ * fStack_5bc,(float)local_5a0 * local_5c0);
        uStack_fd8 = CONCAT44(uStack_598._4_4_ * fStack_5b4,(float)uStack_598 * fStack_5b8);
        uStack_fd0 = CONCAT44(uStack_590._4_4_ * fStack_5ac,(float)uStack_590 * fStack_5b0);
        uStack_fc8 = CONCAT44(uStack_588._4_4_,(float)uStack_588 * fStack_5a8);
        local_398 = local_cb8;
        local_3c0 = local_fe0;
        uStack_3b8 = uStack_fd8;
        uStack_3b0 = uStack_fd0;
        uStack_3a8 = uStack_fc8;
        *(undefined8 *)*local_cb8 = local_fe0;
        *(undefined8 *)(*local_cb8 + 8) = uStack_fd8;
        *(undefined8 *)(*local_cb8 + 0x10) = uStack_fd0;
        *(undefined8 *)(*local_cb8 + 0x18) = uStack_fc8;
        local_cb8 = (undefined1 (*) [64])(*local_cb8 + 0x20);
        local_5a0 = uVar9;
        uStack_598 = uVar62;
        uStack_590 = uVar22;
        uStack_588 = uVar23;
        local_580 = uVar10;
        uStack_578 = uVar11;
        uStack_570 = uVar12;
        pOStack_568 = in_stack_fffffffffffff078;
        local_440 = uVar54;
        uStack_438 = uVar61;
        uStack_430 = uVar67;
        uStack_428 = uVar71;
        local_420 = uVar24;
        uStack_418 = uVar25;
        uStack_410 = uVar26;
        uStack_408 = uVar27;
      }
      local_31c = 0x3f000000;
      local_330 = 0x3f000000;
      uStack_32c = 0x3f000000;
      uStack_328 = 0x3f000000;
      uStack_324 = 0x3f000000;
      local_334 = 0x3f800000;
      local_350 = 0x3f800000;
      uStack_34c = 0x3f800000;
      uStack_348 = 0x3f800000;
      uStack_344 = 0x3f800000;
      local_354 = 0x3f4c4229;
      local_370 = 0x3f4c4229;
      uStack_36c = 0x3f4c4229;
      uStack_368 = 0x3f4c4229;
      uStack_364 = 0x3f4c4229;
      in_stack_ffffffffffffeff0 = 0x3f4c42293f4c4229;
      local_374 = 0x3d372713;
      local_390 = 0x3d372713;
      uStack_38c = 0x3d372713;
      uStack_388 = 0x3d372713;
      uStack_384 = 0x3d372713;
      in_stack_ffffffffffffefe0 = 0x3d3727133d372713;
      in_stack_ffffffffffffefe8 = 0x3d3727133d372713;
      for (; local_d10 + 3 < local_cac; local_d10 = local_d10 + 4) {
        local_318 = local_cb8;
        uVar9 = *(undefined8 *)*local_cb8;
        in_stack_ffffffffffffefd8 = *(undefined8 *)(*local_cb8 + 8);
        local_260._0_4_ = (float)uVar9;
        fVar1 = (float)local_260;
        local_260._4_4_ = (float)((ulong)uVar9 >> 0x20);
        fVar52 = local_260._4_4_;
        uStack_258._0_4_ = (float)in_stack_ffffffffffffefd8;
        uStack_258._4_4_ = (float)((ulong)in_stack_ffffffffffffefd8 >> 0x20);
        local_290 = CONCAT44(local_260._4_4_ * local_260._4_4_,(float)local_260 * (float)local_260);
        uStack_288 = CONCAT44(uStack_258._4_4_ * uStack_258._4_4_,
                              (float)uStack_258 * (float)uStack_258);
        fVar51 = (float)local_260 * (float)local_260 * (float)local_260;
        fVar57 = local_260._4_4_ * local_260._4_4_ * local_260._4_4_;
        fVar59 = (float)uStack_258 * (float)uStack_258 * (float)uStack_258;
        fVar64 = uStack_258._4_4_ * uStack_258._4_4_ * uStack_258._4_4_;
        local_2b0 = CONCAT44(fVar57,fVar51);
        uStack_2a8 = CONCAT44(fVar64,fVar59);
        local_2a0._0_4_ = (float)in_stack_ffffffffffffefe0;
        local_2a0._4_4_ = (float)((ulong)in_stack_ffffffffffffefe0 >> 0x20);
        uStack_298._0_4_ = (float)in_stack_ffffffffffffefe8;
        uStack_298._4_4_ = (float)((ulong)in_stack_ffffffffffffefe8 >> 0x20);
        local_2a0._0_4_ = (float)local_2a0 * fVar51;
        local_2a0._4_4_ = local_2a0._4_4_ * fVar57;
        uStack_298._0_4_ = (float)uStack_298 * fVar59;
        uStack_298._4_4_ = uStack_298._4_4_ * fVar64;
        local_1050 = CONCAT44(local_2a0._4_4_,(float)local_2a0);
        uStackY_1048 = CONCAT44(uStack_298._4_4_,(float)uStack_298);
        local_230 = local_1050;
        uStack_228 = uStackY_1048;
        local_260._0_4_ = (float)local_260 + (float)local_2a0;
        local_260._4_4_ = local_260._4_4_ + local_2a0._4_4_;
        uStack_258._0_4_ = (float)uStack_258 + (float)uStack_298;
        uStack_258._4_4_ = uStack_258._4_4_ + uStack_298._4_4_;
        local_1050 = CONCAT44(local_260._4_4_,(float)local_260);
        uStackY_1048 = CONCAT44(uStack_258._4_4_,(float)uStack_258);
        local_2d0 = local_1050;
        uStack_2c8 = uStackY_1048;
        local_2c0._0_4_ = (float)in_stack_ffffffffffffeff0;
        local_2c0._4_4_ = (float)((ulong)in_stack_ffffffffffffeff0 >> 0x20);
        uStackY_1048 = CONCAT44(uStack_258._4_4_ * 0.7978845,(float)uStack_258 * 0.7978845);
        afVar76[2] = (float)(int)in_stack_ffffffffffffeff0;
        afVar76[3] = (float)(int)((ulong)in_stack_ffffffffffffeff0 >> 0x20);
        afVar76[0] = (float)local_2c0 * (float)local_260;
        afVar76[1] = local_2c0._4_4_ * local_260._4_4_;
        uVar62 = uStackY_1048;
        local_2c0 = in_stack_ffffffffffffeff0;
        uStack_2b8 = 0x3f4c42293f4c4229;
        local_2a0 = in_stack_ffffffffffffefe0;
        uStack_298 = in_stack_ffffffffffffefe8;
        local_280 = uVar9;
        uStack_278 = in_stack_ffffffffffffefd8;
        local_270 = uVar9;
        uStack_268 = in_stack_ffffffffffffefd8;
        local_260 = uVar9;
        uStack_258 = in_stack_ffffffffffffefd8;
        local_220 = uVar9;
        uStack_218 = in_stack_ffffffffffffefd8;
        afVar76 = tanh_ps(afVar76);
        local_250._0_4_ = afVar76[0];
        local_250._4_4_ = afVar76[1];
        uStack_248._0_4_ = (float)uVar62;
        uStack_248._4_4_ = (float)((ulong)uVar62 >> 0x20);
        local_1050 = CONCAT44(local_250._4_4_ + 1.0,(float)local_250 + 1.0);
        uStackY_1048 = CONCAT44(uStack_248._4_4_ + 1.0,(float)uStack_248 + 1.0);
        local_2e0 = local_1050;
        uStack_2d8 = uStackY_1048;
        uStack_2e8._0_4_ = (float)in_stack_ffffffffffffefd8;
        uStack_2e8._4_4_ = (float)((ulong)in_stack_ffffffffffffefd8 >> 0x20);
        local_310 = ((float)local_250 + 1.0) * fVar1;
        fStack_30c = (local_250._4_4_ + 1.0) * fVar52;
        fStack_308 = ((float)uStack_248 + 1.0) * (float)uStack_2e8;
        fStack_304 = (uStack_248._4_4_ + 1.0) * uStack_2e8._4_4_;
        local_1050 = CONCAT44(fStack_30c * 0.5,local_310 * 0.5);
        uStackY_1048 = CONCAT44(fStack_304 * 0.5,fStack_308 * 0.5);
        local_1f8 = local_cb8;
        local_210 = local_1050;
        uStack_208 = uStackY_1048;
        *(undefined8 *)*local_cb8 = local_1050;
        *(undefined8 *)(*local_cb8 + 8) = uStackY_1048;
        local_cb8 = (undefined1 (*) [64])(*local_cb8 + 0x10);
        local_300 = 0x3f0000003f000000;
        uStack_2f8 = 0x3f0000003f000000;
        local_2f0 = uVar9;
        uStack_2e8 = in_stack_ffffffffffffefd8;
        local_250 = afVar76._0_8_;
        uStack_248 = uVar62;
        local_240 = 0x3f8000003f800000;
        uStack_238 = 0x3f8000003f800000;
      }
      for (; local_d10 < local_cac; local_d10 = local_d10 + 1) {
        fVar1 = *(float *)*local_cb8;
        fVar52 = tanhf((*(float *)*local_cb8 +
                       *(float *)*local_cb8 * 0.044715 * *(float *)*local_cb8 * *(float *)*local_cb8
                       ) * 0.7978845);
        *(float *)*local_cb8 = fVar1 * 0.5 * (fVar52 + 1.0);
        local_cb8 = (undefined1 (*) [64])(*local_cb8 + 4);
      }
    }
    local_c7c = 0;
  }
  return local_c7c;
}

Assistant:

int GELU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (!fast_gelu)
    {
        return GELU::forward_inplace(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _half512 = _mm512_set1_ps(0.5f);
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _fast1c512 = _mm512_set1_ps(0.79788452f);
        __m512 _fast2c512 = _mm512_set1_ps(0.044715f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _pLoad = _mm512_loadu_ps(ptr);

            __m512 _cube = _mm512_mul_ps(_pLoad, _pLoad);
            _cube = _mm512_mul_ps(_pLoad, _cube);

            __m512 _blob = _mm512_mul_ps(_fast2c512, _cube);
            _blob = _mm512_add_ps(_pLoad, _blob);
            _blob = _mm512_mul_ps(_fast1c512, _blob);
            _blob = tanh512_ps(_blob);
            _blob = _mm512_add_ps(_one512, _blob);

            _blob = _mm512_mul_ps(_half512, _mm512_mul_ps(_blob, _pLoad));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _half256 = _mm256_set1_ps(0.5f);
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _fast1c256 = _mm256_set1_ps(0.79788452f);
        __m256 _fast2c256 = _mm256_set1_ps(0.044715f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _pLoad = _mm256_loadu_ps(ptr);

            __m256 _cube = _mm256_mul_ps(_pLoad, _pLoad);
            _cube = _mm256_mul_ps(_pLoad, _cube);

            __m256 _blob = _mm256_mul_ps(_fast2c256, _cube);
            _blob = _mm256_add_ps(_pLoad, _blob);
            _blob = _mm256_mul_ps(_fast1c256, _blob);
            _blob = tanh256_ps(_blob);
            _blob = _mm256_add_ps(_one256, _blob);

            _blob = _mm256_mul_ps(_half256, _mm256_mul_ps(_blob, _pLoad));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _half128 = _mm_set1_ps(0.5f);
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _fast1c128 = _mm_set1_ps(0.79788452f);
        __m128 _fast2c128 = _mm_set1_ps(0.044715f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _pLoad = _mm_loadu_ps(ptr);

            __m128 _cube = _mm_mul_ps(_pLoad, _pLoad);
            _cube = _mm_mul_ps(_pLoad, _cube);

            __m128 _blob = _mm_mul_ps(_fast2c128, _cube);
            _blob = _mm_add_ps(_pLoad, _blob);
            _blob = _mm_mul_ps(_fast1c128, _blob);
            _blob = tanh_ps(_blob);
            _blob = _mm_add_ps(_one128, _blob);

            _blob = _mm_mul_ps(_half128, _mm_mul_ps(_blob, _pLoad));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
            *ptr = 0.5f * *ptr * (1.0f + tanhf(0.79788452f * (*ptr + 0.044715f * *ptr * *ptr * *ptr)));

            ptr++;
        }
    }

    return 0;
}